

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::JsonReporter::listListeners
          (JsonReporter *this,
          vector<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
          *descriptions)

{
  pointer pLVar1;
  size_t __n;
  int __fd;
  _Elt_pointer pJVar2;
  pointer pLVar3;
  JsonArrayWriter writer;
  JsonObjectWriter desc_writer;
  JsonValueWriter local_1c8;
  
  startListing(this);
  pJVar2 = (this->m_objectWriters).c.
           super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar2 == (this->m_objectWriters).c.
                super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar2 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  JsonObjectWriter::write((JsonObjectWriter *)&local_1c8,(int)pJVar2 + -0x18,"listeners",9);
  JsonValueWriter::writeArray(&writer,&local_1c8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1c8.m_sstream);
  pLVar1 = (descriptions->
           super__Vector_base<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pLVar3 = (descriptions->
                super__Vector_base<Catch::ListenerDescription,_std::allocator<Catch::ListenerDescription>_>
                )._M_impl.super__Vector_impl_data._M_start; pLVar3 != pLVar1; pLVar3 = pLVar3 + 1) {
    JsonArrayWriter::writeObject(&desc_writer,&writer);
    __n = 4;
    __fd = (int)&desc_writer;
    JsonObjectWriter::write((JsonObjectWriter *)&local_1c8,__fd,"name",4);
    JsonValueWriter::write(&local_1c8,(int)(pLVar3->name).m_start,(void *)(pLVar3->name).m_size,__n)
    ;
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1c8.m_sstream);
    JsonObjectWriter::write((JsonObjectWriter *)&local_1c8,__fd,"description",0xb);
    JsonValueWriter::write<std::__cxx11::string>(&local_1c8,&pLVar3->description);
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1c8.m_sstream);
    JsonObjectWriter::~JsonObjectWriter(&desc_writer);
  }
  JsonArrayWriter::~JsonArrayWriter(&writer);
  return;
}

Assistant:

void JsonReporter::listListeners(
        std::vector<ListenerDescription> const& descriptions ) {
        startListing();

        auto writer =
            m_objectWriters.top().write( "listeners"_sr ).writeArray();

        for ( auto const& desc : descriptions ) {
            auto desc_writer = writer.writeObject();
            desc_writer.write( "name"_sr ).write( desc.name );
            desc_writer.write( "description"_sr ).write( desc.description );
        }
    }